

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

int __thiscall
QMessageBoxDetailsText::copy(QMessageBoxDetailsText *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  undefined8 unaff_RBX;
  
  bVar1 = this->copyAvailable;
  if (bVar1 == true) {
    QTextEdit::copy(&this->textEdit->super_QTextEdit,dst,src);
  }
  return (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar1);
}

Assistant:

bool copy()
    {
#ifdef QT_NO_CLIPBOARD
        return false;
#else
        if (!copyAvailable)
            return false;
        textEdit->copy();
        return true;
#endif
    }